

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void __thiscall duckdb::Executor::VerifyPipeline(Executor *this,Pipeline *pipeline)

{
  pointer psVar1;
  PhysicalOperator *pPVar2;
  Pipeline *this_00;
  reference pvVar3;
  idx_t op_idx;
  ulong __n;
  idx_t other_idx;
  ulong __n_00;
  pointer this_01;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> operators;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> other_operators;
  _Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  local_60;
  _Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  local_48;
  
  Pipeline::GetOperators
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)&local_60,pipeline);
  psVar1 = (this->pipelines).
           super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->pipelines).
                 super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                 .
                 super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != psVar1; this_01 = this_01 + 1
      ) {
    this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->(this_01);
    Pipeline::GetOperators
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)&local_48,this_00);
    for (__n = 0; __n < (ulong)((long)local_60._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_60._M_impl.super__Vector_impl_data._M_start >> 3);
        __n = __n + 1) {
      for (__n_00 = 0;
          __n_00 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3);
          __n_00 = __n_00 + 1) {
        pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                           ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                            &local_60,__n);
        pPVar2 = pvVar3->_M_data;
        pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                           ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                            &local_48,__n_00);
        (*pPVar2->_vptr_PhysicalOperator[6])(pPVar2,pvVar3->_M_data);
      }
    }
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    ::~_Vector_base(&local_48);
  }
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::~_Vector_base(&local_60);
  return;
}

Assistant:

void Executor::VerifyPipeline(Pipeline &pipeline) {
	D_ASSERT(!pipeline.ToString().empty());
	auto operators = pipeline.GetOperators();
	for (auto &other_pipeline : pipelines) {
		auto other_operators = other_pipeline->GetOperators();
		for (idx_t op_idx = 0; op_idx < operators.size(); op_idx++) {
			for (idx_t other_idx = 0; other_idx < other_operators.size(); other_idx++) {
				auto &left = operators[op_idx].get();
				auto &right = other_operators[other_idx].get();
				if (left.Equals(right)) {
					D_ASSERT(right.Equals(left));
				} else {
					D_ASSERT(!right.Equals(left));
				}
			}
		}
	}
}